

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FieldDescriptor::FieldTypeNameDebugString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this)

{
  char *pcVar1;
  Type TVar2;
  Descriptor *this_00;
  EnumDescriptor *this_01;
  string *psVar3;
  allocator local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *this_local;
  
  local_18 = this;
  this_local = (FieldDescriptor *)__return_storage_ptr__;
  TVar2 = type(this);
  if (TVar2 == TYPE_MESSAGE) {
    this_00 = message_type(this);
    psVar3 = Descriptor::full_name_abi_cxx11_(this_00);
    std::operator+(__return_storage_ptr__,".",psVar3);
  }
  else if (TVar2 == TYPE_ENUM) {
    this_01 = enum_type(this);
    psVar3 = EnumDescriptor::full_name_abi_cxx11_(this_01);
    std::operator+(__return_storage_ptr__,".",psVar3);
  }
  else {
    TVar2 = type(this);
    pcVar1 = *(char **)(kTypeToName + (ulong)TVar2 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::FieldTypeNameDebugString() const {
  switch (type()) {
    case TYPE_MESSAGE:
      return "." + message_type()->full_name();
    case TYPE_ENUM:
      return "." + enum_type()->full_name();
    default:
      return kTypeToName[type()];
  }
}